

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<bool> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined1 *in_RSI;
  ParamGenerator<bool> PVar3;
  initializer_list<bool> __l;
  _Bit_const_iterator begin;
  allocator_type local_3b;
  bool local_3a;
  undefined1 local_39;
  vector<bool,_std::allocator<bool>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_3a = (bool)*in_RSI;
  local_39 = in_RSI[1];
  __l._M_len = 2;
  __l._M_array = &local_3a;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_38,__l,&local_3b);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  begin.super__Bit_iterator_base._8_8_ =
       local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  begin.super__Bit_iterator_base._M_p = (_Bit_type *)this;
  PVar3 = ValuesIn<std::_Bit_const_iterator>(begin,(_Bit_const_iterator)(auVar1 << 0x40));
  _Var2._M_pi = PVar3.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_38.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    _Var2._M_pi = extraout_RDX;
  }
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<bool>)
         PVar3.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(std::make_index_sequence<sizeof...(Ts)>()));
  }